

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSources::DeleteOwnSSRC(RTPSources *this)

{
  RTPInternalSourceData *pRVar1;
  uint32_t ssrc;
  
  if (this->owndata != (RTPInternalSourceData *)0x0) {
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
    ::GotoElement(&this->sourcelist,&ssrc);
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
    ::DeleteCurrentElement(&this->sourcelist);
    this->totalcount = this->totalcount + -1;
    pRVar1 = this->owndata;
    if ((pRVar1->super_RTPSourceData).issender == true) {
      this->sendercount = this->sendercount + -1;
    }
    if (((pRVar1->super_RTPSourceData).validated == true) &&
       (((pRVar1->super_RTPSourceData).receivedbye & 1U) == 0)) {
      this->activecount = this->activecount + -1;
    }
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this);
    RTPDelete<jrtplib::RTPInternalSourceData>(this->owndata,(this->super_RTPMemoryObject).mgr);
    this->owndata = (RTPInternalSourceData *)0x0;
    return 0;
  }
  return -0x42;
}

Assistant:

int RTPSources::DeleteOwnSSRC()
{
	if (owndata == 0)
		return ERR_RTP_SOURCES_DONTHAVEOWNSSRC;

	uint32_t ssrc = owndata->GetSSRC();

	sourcelist.GotoElement(ssrc);
	sourcelist.DeleteCurrentElement();

	totalcount--;
	if (owndata->IsSender())
		sendercount--;
	if (owndata->IsActive())
		activecount--;

	OnRemoveSource(owndata);
	
	RTPDelete(owndata,GetMemoryManager());
	owndata = 0;
	return 0;
}